

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef lj_opt_dse_fstore(jit_State *J)

{
  ushort uVar1;
  IRRef1 IVar2;
  ushort uVar3;
  IRIns *pIVar4;
  AliasRet AVar5;
  TRef TVar6;
  IRIns *pIVar7;
  IRIns *pIVar8;
  IRRef1 *pIVar9;
  
  uVar1 = (J->fold).ins.field_0.op1;
  IVar2 = (J->fold).ins.field_0.op2;
  pIVar4 = (J->cur).ir;
  pIVar9 = J->chain + 0x4a;
  while( true ) {
    uVar3 = *pIVar9;
    if (uVar3 <= uVar1) break;
    pIVar8 = pIVar4 + uVar3;
    AVar5 = aa_fref(J,pIVar4 + uVar1,pIVar4 + (pIVar8->field_0).op1);
    if (AVar5 == ALIAS_MAY) {
      if ((pIVar8->field_0).op2 != IVar2) break;
    }
    else if (AVar5 == ALIAS_MUST) {
      if ((pIVar8->field_0).op2 == IVar2) {
        return 4;
      }
      if (J->chain[0x11] < uVar3) {
        pIVar7 = pIVar4 + ((J->cur).nins - 1);
        goto LAB_00125dd5;
      }
      break;
    }
    pIVar9 = &(pIVar8->field_0).prev;
  }
LAB_00125e0e:
  TVar6 = lj_ir_emit(J);
  return TVar6;
LAB_00125dd5:
  if (pIVar7 <= pIVar8) goto LAB_00125df6;
  if (((char)(pIVar7->field_1).t.irt < '\0') ||
     (((pIVar7->field_1).o == 'C' && ((pIVar7->field_0).op2 == pIVar4[uVar1].field_0.op2))))
  goto LAB_00125e0e;
  pIVar7 = pIVar7 + -1;
  goto LAB_00125dd5;
LAB_00125df6:
  *pIVar9 = (pIVar8->field_0).prev;
  *pIVar8 = (IRIns)0xc0000000000;
  goto LAB_00125e0e;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_fstore(jit_State *J)
{
  IRRef fref = fins->op1;  /* FREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(fref);
  IRRef1 *refp = &J->chain[IR_FSTORE];
  IRRef ref = *refp;
  while (ref > fref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_fref(J, xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards or conflicting loads. */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t) || (ir->o == IR_FLOAD && ir->op2 == xr->op2))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	store->o = IR_NOP;
	store->t.irt = IRT_NIL;
	store->op1 = store->op2 = 0;
	store->prev = 0;
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}